

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * pcache1Alloc(int nByte)

{
  int N;
  PgFreeslot *pPStack_18;
  int sz;
  void *p;
  int nByte_local;
  
  pPStack_18 = (PgFreeslot *)0x0;
  if (nByte <= pcache1_g.szSlot) {
    sqlite3_mutex_enter(pcache1_g.mutex);
    pPStack_18 = pcache1_g.pFree;
    if (pcache1_g.pFree != (PgFreeslot *)0x0) {
      pcache1_g.pFree = (pcache1_g.pFree)->pNext;
      pcache1_g.nFreeSlot = pcache1_g.nFreeSlot + -1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot < pcache1_g.nReserve);
      sqlite3StatusHighwater(7,nByte);
      sqlite3StatusUp(1,1);
    }
    sqlite3_mutex_leave(pcache1_g.mutex);
  }
  if ((pPStack_18 == (PgFreeslot *)0x0) &&
     (pPStack_18 = (PgFreeslot *)sqlite3Malloc((long)nByte), pPStack_18 != (PgFreeslot *)0x0)) {
    N = sqlite3MallocSize(pPStack_18);
    sqlite3_mutex_enter(pcache1_g.mutex);
    sqlite3StatusHighwater(7,nByte);
    sqlite3StatusUp(2,N);
    sqlite3_mutex_leave(pcache1_g.mutex);
  }
  return pPStack_18;
}

Assistant:

static void *pcache1Alloc(int nByte){
  void *p = 0;
  assert( sqlite3_mutex_notheld(pcache1.grp.mutex) );
  if( nByte<=pcache1.szSlot ){
    sqlite3_mutex_enter(pcache1.mutex);
    p = (PgHdr1 *)pcache1.pFree;
    if( p ){
      pcache1.pFree = pcache1.pFree->pNext;
      pcache1.nFreeSlot--;
      pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
      assert( pcache1.nFreeSlot>=0 );
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_USED, 1);
    }
    sqlite3_mutex_leave(pcache1.mutex);
  }
  if( p==0 ){
    /* Memory is not available in the SQLITE_CONFIG_PAGECACHE pool.  Get
    ** it from sqlite3Malloc instead.
    */
    p = sqlite3Malloc(nByte);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    if( p ){
      int sz = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1.mutex);
      sqlite3StatusHighwater(SQLITE_STATUS_PAGECACHE_SIZE, nByte);
      sqlite3StatusUp(SQLITE_STATUS_PAGECACHE_OVERFLOW, sz);
      sqlite3_mutex_leave(pcache1.mutex);
    }
#endif
    sqlite3MemdebugSetType(p, MEMTYPE_PCACHE);
  }
  return p;
}